

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void * nk_draw_vertex(void *dst,nk_convert_config *config,nk_vec2 pos,nk_vec2 uv,nk_colorf color)

{
  nk_size nVar1;
  nk_size nVar2;
  short sVar3;
  nk_draw_vertex_layout_attribute nVar4;
  nk_color nVar5;
  short sVar6;
  ulong in_RCX;
  short sVar7;
  short sVar8;
  nk_draw_vertex_layout_format value_count;
  undefined4 uVar9;
  uint uVar10;
  nk_size length;
  undefined2 uVar11;
  undefined4 uVar12;
  nk_colorf *src0;
  nk_vec2 *values;
  undefined4 uVar13;
  nk_draw_vertex_layout_format *pnVar15;
  float fVar16;
  float fVar17;
  undefined4 uVar18;
  uint uVar19;
  double dVar20;
  nk_uint col [4];
  nk_colorf local_78;
  undefined8 local_68;
  undefined8 local_60;
  double local_58;
  double local_50;
  nk_vec2 local_40;
  nk_vec2 local_38;
  ulong uVar14;
  
  nVar1 = config->vertex_size;
  nVar4 = config->vertex_layout->attribute;
  if (nVar4 != NK_VERTEX_ATTRIBUTE_COUNT) {
    pnVar15 = &config->vertex_layout->format;
    uVar14 = 0;
    uVar13 = 0;
    local_78 = color;
    local_40 = uv;
    local_38 = pos;
    do {
      dVar20 = local_68;
      if (*pnVar15 == NK_FORMAT_COUNT) break;
      nVar2 = *(nk_size *)(pnVar15 + 1);
      if (nVar4 == NK_VERTEX_POSITION) {
        value_count = *pnVar15;
        values = &local_38;
LAB_001208b2:
        nk_draw_vertex_element
                  ((void *)(nVar2 + (long)dst),&values->x,value_count,
                   (nk_draw_vertex_layout_format)in_RCX);
        goto LAB_001208b7;
      }
      if (nVar4 != NK_VERTEX_COLOR) {
        if (nVar4 != NK_VERTEX_TEXCOORD) {
          __assert_fail("0 && \"wrong element attribute\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                        ,0x1feb,
                        "void *nk_draw_vertex(void *, const struct nk_convert_config *, struct nk_vec2, struct nk_vec2, struct nk_colorf)"
                       );
        }
        value_count = *pnVar15;
        values = &local_40;
        goto LAB_001208b2;
      }
      if (*pnVar15 < NK_FORMAT_COLOR_BEGIN) {
        __assert_fail("format >= NK_FORMAT_COLOR_BEGIN",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x1f68,
                      "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                     );
      }
      switch(*pnVar15) {
      case NK_FORMAT_COLOR_BEGIN:
      case NK_FORMAT_R8G8B8A8:
      case NK_FORMAT_RGB32:
      case NK_FORMAT_COLOR_END:
        nVar5 = nk_rgba_f(local_78.r,local_78.g,local_78.b,local_78.a);
        goto LAB_0012088f;
      case NK_FORMAT_R16G15B16:
        fVar16 = local_78.b * 65535.0;
        sVar6 = (fVar16 < 0.0 && fVar16 < 65535.0) - 1;
        sVar3 = (short)(int)fVar16;
        if (65535.0 <= fVar16) {
          sVar3 = sVar6;
        }
        fVar17 = local_78.g * 65535.0;
        if (fVar16 < 0.0) {
          sVar3 = sVar6;
        }
        sVar7 = (fVar17 < 0.0 && fVar17 < 65535.0) - 1;
        sVar6 = (short)(int)fVar17;
        if (65535.0 <= fVar17) {
          sVar6 = sVar7;
        }
        fVar16 = local_78.r * 65535.0;
        if (fVar17 < 0.0) {
          sVar6 = sVar7;
        }
        uVar10 = (fVar16 < 0.0 && fVar16 < 65535.0) - 1;
        in_RCX = (ulong)uVar10;
        uVar19 = (int)fVar16;
        if (65535.0 <= fVar16) {
          uVar19 = uVar10;
        }
        uVar11 = (undefined2)uVar19;
        if (fVar16 < 0.0) {
          uVar11 = (undefined2)uVar10;
        }
        local_68._0_4_ = CONCAT22(sVar6,uVar11);
        local_68._6_2_ = SUB82(dVar20,6);
        local_68._0_6_ = CONCAT24(sVar3,(undefined4)local_68);
        length = 6;
        break;
      case NK_FORMAT_R32G32B32:
        fVar16 = local_78.r * 4.2949673e+09;
        uVar18 = (int)(long)fVar16;
        if (4.2949673e+09 <= fVar16) {
          uVar18 = uVar13;
        }
        if (fVar16 < 0.0) {
          uVar18 = uVar13;
        }
        fVar16 = local_78.g * 4.2949673e+09;
        in_RCX = (long)fVar16 & 0xffffffff;
        if (4.2949673e+09 <= fVar16) {
          in_RCX = uVar14;
        }
        if (fVar16 < 0.0) {
          in_RCX = uVar14;
        }
        fVar16 = local_78.b * 4.2949673e+09;
        uVar9 = (int)(long)fVar16;
        if (4.2949673e+09 <= fVar16) {
          uVar9 = uVar13;
        }
        local_68 = (double)CONCAT44((int)in_RCX,uVar18);
        if (fVar16 < 0.0) {
          uVar9 = uVar13;
        }
        local_60 = CONCAT44(local_60._4_4_,uVar9);
        length = 0xc;
        break;
      case NK_FORMAT_B8G8R8A8:
        nVar5 = nk_rgba_f(local_78.r,local_78.g,local_78.b,local_78.a);
        uVar19 = (uint)nVar5 >> 0x10 & 0xff;
        in_RCX = (ulong)uVar19;
        nVar5 = (nk_color)((uint)nVar5 & 0xff00ff00 | ((uint)nVar5 & 0xff) << 0x10 | uVar19);
LAB_0012088f:
        local_68 = (double)CONCAT44(local_68._4_4_,nVar5);
        length = 4;
        break;
      case NK_FORMAT_R16G15B16A16:
        fVar16 = local_78.a * 65535.0;
        sVar6 = (fVar16 < 0.0 && fVar16 < 65535.0) - 1;
        sVar3 = (short)(int)fVar16;
        if (65535.0 <= fVar16) {
          sVar3 = sVar6;
        }
        fVar17 = local_78.b * 65535.0;
        if (fVar16 < 0.0) {
          sVar3 = sVar6;
        }
        uVar10 = (fVar17 < 0.0 && fVar17 < 65535.0) - 1;
        uVar19 = (int)fVar17;
        if (65535.0 <= fVar17) {
          uVar19 = uVar10;
        }
        fVar16 = local_78.g * 65535.0;
        if (fVar17 < 0.0) {
          uVar19 = uVar10;
        }
        in_RCX = (ulong)uVar19;
        sVar7 = (fVar16 < 0.0 && fVar16 < 65535.0) - 1;
        sVar6 = (short)(int)fVar16;
        if (65535.0 <= fVar16) {
          sVar6 = sVar7;
        }
        fVar17 = local_78.r * 65535.0;
        if (fVar16 < 0.0) {
          sVar6 = sVar7;
        }
        sVar8 = (fVar17 < 0.0 && fVar17 < 65535.0) - 1;
        sVar7 = (short)(int)fVar17;
        if (65535.0 <= fVar17) {
          sVar7 = sVar8;
        }
        if (fVar17 < 0.0) {
          sVar7 = sVar8;
        }
        local_68._0_4_ = CONCAT22(sVar6,sVar7);
        local_68._0_6_ = CONCAT24((short)uVar19,(undefined4)local_68);
        local_68 = (double)CONCAT26(sVar3,(undefined6)local_68);
        length = 8;
        break;
      case NK_FORMAT_R32G32B32A32:
        fVar16 = local_78.r * 4.2949673e+09;
        uVar18 = (int)(long)fVar16;
        if (4.2949673e+09 <= fVar16) {
          uVar18 = uVar13;
        }
        if (fVar16 < 0.0) {
          uVar18 = uVar13;
        }
        fVar16 = local_78.g * 4.2949673e+09;
        in_RCX = (long)fVar16 & 0xffffffff;
        if (4.2949673e+09 <= fVar16) {
          in_RCX = uVar14;
        }
        if (fVar16 < 0.0) {
          in_RCX = uVar14;
        }
        fVar16 = local_78.b * 4.2949673e+09;
        uVar9 = (int)(long)fVar16;
        if (4.2949673e+09 <= fVar16) {
          uVar9 = uVar13;
        }
        if (fVar16 < 0.0) {
          uVar9 = uVar13;
        }
        fVar16 = local_78.a * 4.2949673e+09;
        uVar12 = (int)(long)fVar16;
        if (4.2949673e+09 <= fVar16) {
          uVar12 = uVar13;
        }
        local_68 = (double)CONCAT44((int)in_RCX,uVar18);
        if (fVar16 < 0.0) {
          uVar12 = uVar13;
        }
        local_60 = CONCAT44(uVar12,uVar9);
        length = 0x10;
        break;
      case NK_FORMAT_R32G32B32A32_FLOAT:
        length = 0x10;
        src0 = &local_78;
        goto LAB_001208a0;
      case NK_FORMAT_R32G32B32A32_DOUBLE:
        uVar19 = 0x3ff00000;
        if (local_78.a <= 0.0) {
          uVar19 = 0;
        }
        local_50 = 1.0;
        if (local_78.a <= 1.0) {
          local_50 = (double)((ulong)uVar19 << 0x20);
        }
        dVar20 = local_50;
        if (0.0 < local_78.a) {
          dVar20 = (double)local_78.a;
        }
        if (local_78.a <= 1.0) {
          local_50 = dVar20;
        }
        dVar20 = 1.0;
        if (local_78.b <= 0.0) {
          dVar20 = 0.0;
        }
        local_58 = 1.0;
        if (local_78.b <= 1.0) {
          local_58 = dVar20;
        }
        dVar20 = local_58;
        if (0.0 < local_78.b) {
          dVar20 = (double)local_78.b;
        }
        if (local_78.b <= 1.0) {
          local_58 = dVar20;
        }
        uVar19 = 0x3ff00000;
        if (local_78.g <= 0.0) {
          uVar19 = 0;
        }
        uVar10 = 0x3ff00000;
        if (local_78.g <= 1.0) {
          uVar10 = uVar19;
        }
        uVar18 = 0;
        if (0.0 < local_78.g) {
          dVar20 = (double)local_78.g;
        }
        else {
          dVar20 = (double)((ulong)uVar10 << 0x20);
        }
        if (local_78.g <= 1.0) {
          uVar18 = SUB84(dVar20,0);
          uVar10 = (uint)((ulong)dVar20 >> 0x20);
        }
        dVar20 = 1.0;
        if (local_78.r <= 0.0) {
          dVar20 = 0.0;
        }
        local_68 = 1.0;
        if (local_78.r <= 1.0) {
          local_68 = dVar20;
        }
        dVar20 = local_68;
        if (0.0 < local_78.r) {
          dVar20 = (double)local_78.r;
        }
        if (local_78.r <= 1.0) {
          local_68 = dVar20;
        }
        local_60 = CONCAT44(uVar10,uVar18);
        length = 0x20;
        break;
      default:
        __assert_fail("format <= NK_FORMAT_COLOR_END",
                      "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                      ,0x1f69,
                      "void nk_draw_vertex_color(void *, const float *, enum nk_draw_vertex_layout_format)"
                     );
      }
      src0 = (nk_colorf *)&local_68;
LAB_001208a0:
      nk_memcopy((void *)(nVar2 + (long)dst),src0,length);
LAB_001208b7:
      nVar4 = pnVar15[3];
      pnVar15 = pnVar15 + 4;
    } while (nVar4 != NK_VERTEX_ATTRIBUTE_COUNT);
  }
  return (void *)((long)dst + nVar1);
}

Assistant:

NK_INTERN void*
nk_draw_vertex(void *dst, const struct nk_convert_config *config,
    struct nk_vec2 pos, struct nk_vec2 uv, struct nk_colorf color)
{
    void *result = (void*)((char*)dst + config->vertex_size);
    const struct nk_draw_vertex_layout_element *elem_iter = config->vertex_layout;
    while (!nk_draw_vertex_layout_element_is_end_of_layout(elem_iter)) {
        void *address = (void*)((char*)dst + elem_iter->offset);
        switch (elem_iter->attribute) {
        case NK_VERTEX_ATTRIBUTE_COUNT:
        default: NK_ASSERT(0 && "wrong element attribute");
        case NK_VERTEX_POSITION: nk_draw_vertex_element(address, &pos.x, 2, elem_iter->format); break;
        case NK_VERTEX_TEXCOORD: nk_draw_vertex_element(address, &uv.x, 2, elem_iter->format); break;
        case NK_VERTEX_COLOR: nk_draw_vertex_color(address, &color.r, elem_iter->format); break;
        }
        elem_iter++;
    }
    return result;
}